

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

EnumDescriptorProto * __thiscall
google::protobuf::descriptor_unittest::AddEnum
          (descriptor_unittest *this,FileDescriptorProto *file,string_view name)

{
  EnumDescriptorProto *pEVar1;
  Arena *arena;
  string_view value;
  
  value._M_str = (char *)name._M_len;
  pEVar1 = (EnumDescriptorProto *)
           protobuf::internal::RepeatedPtrFieldBase::AddMessageLite
                     ((RepeatedPtrFieldBase *)(this + 0x48),
                      Arena::DefaultConstruct<google::protobuf::EnumDescriptorProto>);
  *(byte *)&pEVar1->field_0 = *(byte *)&pEVar1->field_0 | 1;
  arena = (Arena *)(pEVar1->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  value._M_len = (size_t)file;
  protobuf::internal::ArenaStringPtr::Set(&(pEVar1->field_0)._impl_.name_,value,arena);
  return pEVar1;
}

Assistant:

EnumDescriptorProto* AddEnum(FileDescriptorProto* file,
                             absl::string_view name) {
  EnumDescriptorProto* result = file->add_enum_type();
  result->set_name(name);
  return result;
}